

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_add_image(nk_draw_list *list,nk_image texture,nk_rect rect,nk_color color)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  ulong uVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  nk_image nVar10;
  undefined4 extraout_EAX;
  int iVar11;
  undefined1 extraout_XMM0 [16];
  nk_vec2 c;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  nk_vec2 uva;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  nk_vec2 uvc;
  undefined1 auVar16 [16];
  undefined2 uVar17;
  float local_38;
  float fStack_34;
  
  nVar10 = texture;
  if (list != (nk_draw_list *)0x0) {
    nk_draw_list_push_image(list,texture.handle);
    uVar7 = texture._8_8_;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar7;
    auVar12 = pshuflw(extraout_XMM0,auVar12,0x50);
    auVar14._0_2_ = -(ushort)(auVar12._0_2_ == 0);
    auVar14._2_2_ = -(ushort)(auVar12._2_2_ == 0);
    auVar14._4_2_ = -(ushort)(auVar12._0_2_ == 0);
    auVar14._6_2_ = -(ushort)(auVar12._2_2_ == 0);
    auVar14._8_2_ = -(ushort)(auVar12._4_2_ == 0);
    auVar14._10_2_ = -(ushort)(auVar12._6_2_ == 0);
    auVar14._12_2_ = -(ushort)(auVar12._4_2_ == 0);
    auVar14._14_2_ = -(ushort)(auVar12._6_2_ == 0);
    iVar11 = movmskpd(extraout_EAX,auVar14);
    local_38 = rect.w;
    fStack_34 = rect.h;
    if (iVar11 == 3) {
      c.x = rect.x + local_38;
      c.y = rect.y + fStack_34;
      uvc.x = 1.0;
      uvc.y = 1.0;
      uva.x = 0.0;
      uva.y = 0.0;
    }
    else {
      auVar1._8_4_ = 0;
      auVar1._0_8_ = uVar7;
      auVar1._12_2_ = texture.region[1];
      auVar3._8_2_ = texture.region[0];
      auVar3._0_8_ = uVar7;
      auVar3._10_4_ = auVar1._10_4_;
      auVar8._6_8_ = 0;
      auVar8._0_6_ = auVar3._8_6_;
      auVar5._4_2_ = texture.h;
      auVar5._0_4_ = texture._8_4_;
      auVar5._6_8_ = SUB148(auVar8 << 0x40,6);
      auVar13._0_4_ = (float)(texture._8_4_ & 0xffff);
      auVar13._4_4_ = (float)auVar5._4_4_;
      auVar13._8_4_ = (float)auVar3._8_4_;
      auVar13._12_4_ = (float)(auVar1._10_4_ >> 0x10);
      auVar15._0_4_ = (float)(texture.region._0_4_ & 0xffff);
      auVar15._4_4_ = (float)((uint)texture.region._0_4_ >> 0x10);
      auVar15._8_8_ = 0;
      auVar12 = divps(auVar15,auVar13);
      uva = auVar12._0_8_;
      uVar17 = texture._22_2_;
      auVar2._8_4_ = 0;
      auVar2._0_2_ = texture.region[2];
      auVar2._2_2_ = texture.region[3];
      auVar2._4_4_ = texture._20_4_;
      auVar2._12_2_ = uVar17;
      auVar4._8_2_ = nVar10._20_2_;
      auVar4._0_2_ = texture.region[2];
      auVar4._2_2_ = texture.region[3];
      auVar4._4_4_ = texture._20_4_;
      auVar4._10_4_ = auVar2._10_4_;
      auVar9._6_8_ = 0;
      auVar9._0_6_ = auVar4._8_6_;
      auVar6._4_2_ = nVar10.region[3];
      auVar6._0_4_ = nVar10.region._4_4_;
      auVar6._6_8_ = SUB148(auVar9 << 0x40,6);
      auVar16._0_4_ = (float)((nVar10.region._4_4_ & 0xffff) + (texture.region._0_4_ & 0xffff));
      auVar16._4_4_ = (float)(auVar6._4_4_ + ((uint)texture.region._0_4_ >> 0x10));
      auVar16._8_4_ = (float)auVar4._8_4_;
      auVar16._12_4_ = (float)(auVar2._10_4_ >> 0x10);
      auVar12 = divps(auVar16,auVar13);
      uvc = auVar12._0_8_;
      c.x = rect.x + local_38;
      c.y = rect.y + fStack_34;
    }
    nk_draw_list_push_rect_uv(list,rect._0_8_,c,uva,uvc,color);
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x1dad,
                "void nk_draw_list_add_image(struct nk_draw_list *, struct nk_image, struct nk_rect, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_draw_list_add_image(struct nk_draw_list *list, struct nk_image texture,
    struct nk_rect rect, struct nk_color color)
{
    NK_ASSERT(list);
    if (!list) return;
    /* push new command with given texture */
    nk_draw_list_push_image(list, texture.handle);
    if (nk_image_is_subimage(&texture)) {
        /* add region inside of the texture  */
        struct nk_vec2 uv[2];
        uv[0].x = (float)texture.region[0]/(float)texture.w;
        uv[0].y = (float)texture.region[1]/(float)texture.h;
        uv[1].x = (float)(texture.region[0] + texture.region[2])/(float)texture.w;
        uv[1].y = (float)(texture.region[1] + texture.region[3])/(float)texture.h;
        nk_draw_list_push_rect_uv(list, nk_vec2(rect.x, rect.y),
            nk_vec2(rect.x + rect.w, rect.y + rect.h),  uv[0], uv[1], color);
    } else nk_draw_list_push_rect_uv(list, nk_vec2(rect.x, rect.y),
            nk_vec2(rect.x + rect.w, rect.y + rect.h),
            nk_vec2(0.0f, 0.0f), nk_vec2(1.0f, 1.0f),color);
}